

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * parse_object(cJSON *item,char *value)

{
  char *pcVar1;
  cJSON *item_00;
  cJSON *new_item;
  cJSON *child;
  char *value_local;
  cJSON *item_local;
  
  if (*value == '{') {
    item->type = 6;
    pcVar1 = skip(value + 1);
    if (*pcVar1 == '}') {
      item_local = (cJSON *)(pcVar1 + 1);
    }
    else {
      new_item = cJSON_New_Item();
      item->child = new_item;
      if (item->child == (cJSON *)0x0) {
        item_local = (cJSON *)0x0;
      }
      else {
        pcVar1 = skip(pcVar1);
        pcVar1 = parse_string(new_item,pcVar1);
        pcVar1 = skip(pcVar1);
        if (pcVar1 == (char *)0x0) {
          item_local = (cJSON *)0x0;
        }
        else {
          new_item->string = new_item->valuestring;
          new_item->valuestring = (char *)0x0;
          if (*pcVar1 == ':') {
            pcVar1 = skip(pcVar1 + 1);
            pcVar1 = parse_value(new_item,pcVar1);
            child = (cJSON *)skip(pcVar1);
            if (child == (cJSON *)0x0) {
              item_local = (cJSON *)0x0;
            }
            else {
              do {
                if (*(char *)&child->next != ',') {
                  if (*(char *)&child->next == '}') {
                    return (char *)((long)&child->next + 1);
                  }
                  ep = (char *)child;
                  return (char *)0x0;
                }
                item_00 = cJSON_New_Item();
                if (item_00 == (cJSON *)0x0) {
                  return (char *)0x0;
                }
                new_item->next = item_00;
                item_00->prev = new_item;
                pcVar1 = skip((char *)((long)&child->next + 1));
                pcVar1 = parse_string(item_00,pcVar1);
                pcVar1 = skip(pcVar1);
                if (pcVar1 == (char *)0x0) {
                  return (char *)0x0;
                }
                item_00->string = item_00->valuestring;
                item_00->valuestring = (char *)0x0;
                if (*pcVar1 != ':') {
                  ep = pcVar1;
                  return (char *)0x0;
                }
                pcVar1 = skip(pcVar1 + 1);
                pcVar1 = parse_value(item_00,pcVar1);
                child = (cJSON *)skip(pcVar1);
                new_item = item_00;
              } while (child != (cJSON *)0x0);
              item_local = (cJSON *)0x0;
            }
          }
          else {
            item_local = (cJSON *)0x0;
            ep = pcVar1;
          }
        }
      }
    }
  }
  else {
    item_local = (cJSON *)0x0;
    ep = value;
  }
  return (char *)item_local;
}

Assistant:

static const char *
parse_object(cJSON *item, const char *value)
{
    cJSON *child;
    if (*value != '{') {
        ep = value;
        return 0;
    } /* not an object! */

    item->type = cJSON_Object;
    value = skip(value + 1);
    if (*value == '}')
        return value + 1; /* empty array. */

    item->child = child = cJSON_New_Item();
    if (!item->child)
        return 0;
    value = skip(parse_string(child, skip(value)));
    if (!value)
        return 0;
    child->string = child->valuestring;
    child->valuestring = 0;
    if (*value != ':') {
        ep = value;
        return 0;
    }                                                  /* fail! */
    value = skip(parse_value(child, skip(value + 1))); /* skip any spacing, get the value. */
    if (!value)
        return 0;

    while (*value == ',') {
        cJSON *new_item;
        if (!(new_item = cJSON_New_Item()))
            return 0; /* memory fail */
        child->next = new_item;
        new_item->prev = child;
        child = new_item;
        value = skip(parse_string(child, skip(value + 1)));
        if (!value)
            return 0;
        child->string = child->valuestring;
        child->valuestring = 0;
        if (*value != ':') {
            ep = value;
            return 0;
        }                                                  /* fail! */
        value = skip(parse_value(child, skip(value + 1))); /* skip any spacing, get the value. */
        if (!value)
            return 0;
    }

    if (*value == '}')
        return value + 1; /* end of array */
    ep = value;
    return 0; /* malformed. */
}